

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

String * __thiscall
kj::encodeBase64(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input,
                bool breakLines)

{
  kj *pkVar1;
  kj kVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  size_t total;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  size_t local_30;
  
  lVar12 = 3;
  sVar7 = ((ulong)(input.ptr + 2) / 3) * 4;
  if ((int)input.size_ != 0) {
    sVar7 = sVar7 + (((int)(sVar7 / 0x48) + 1) - (uint)(sVar7 % 0x48 == 0));
  }
  heapString(__return_storage_ptr__,sVar7);
  pcVar4 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->content).ptr;
  }
  lVar9 = (long)(int)input.ptr;
  pkVar1 = this + lVar9;
  iVar5 = 0;
  pcVar8 = pcVar4;
  do {
    iVar3 = (int)pcVar4;
    iVar6 = (int)pcVar8;
    if (lVar9 == 0) {
      total = (size_t)(iVar6 - iVar3);
      pcVar4 = pcVar4 + total;
      pcVar8 = pcVar4;
LAB_0040c172:
      if (((byte)input.size_ != 0) && (0 < iVar5)) {
        *pcVar8 = '\n';
        pcVar8 = pcVar8 + 1;
      }
      total = (long)((int)pcVar8 - (int)pcVar4) + total;
      sVar7 = (__return_storage_ptr__->content).size_;
      _kjCondition.right = 0;
      if (sVar7 != 0) {
        _kjCondition.right = sVar7 - 1;
      }
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = total == _kjCondition.right;
      if (_kjCondition.result) {
        return __return_storage_ptr__;
      }
      _kjCondition.left = &total;
      local_30 = _kjCondition.right;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,unsigned_long&,unsigned_long>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding.c++"
                 ,0x351,FAILED,"total == output.size()","_kjCondition,total, output.size()",
                 &_kjCondition,&total,&local_30);
      _::Debug::Fault::fatal(&f);
    }
    kVar2 = *this;
    *pcVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(byte)kVar2 >> 2];
    uVar11 = (ulong)(((byte)kVar2 & 3) << 4);
    if (this + 1 == pkVar1) {
      total = (size_t)((iVar6 + 1) - iVar3);
      pcVar8 = pcVar4 + total;
      pcVar10 = pcVar8 + 2;
      *pcVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar11];
      pcVar8[1] = '=';
LAB_0040c16a:
      pcVar4 = pcVar4 + total;
      *pcVar10 = '=';
      iVar5 = iVar5 + 1;
      pcVar8 = pcVar4 + lVar12;
      goto LAB_0040c172;
    }
    kVar2 = this[1];
    pcVar8[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(byte)kVar2 >> 4 | uVar11];
    uVar11 = (ulong)(((byte)kVar2 & 0xf) << 2);
    if (this + 2 == pkVar1) {
      total = (size_t)((iVar6 + 2) - iVar3);
      pcVar10 = pcVar4 + total + 1;
      pcVar4[total] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar11];
      lVar12 = 2;
      goto LAB_0040c16a;
    }
    kVar2 = this[2];
    pcVar8[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(byte)kVar2 >> 6 | uVar11];
    pcVar8[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(byte)kVar2 & 0x3f];
    iVar5 = iVar5 + 1;
    if ((iVar5 == 0x12 & (byte)input.size_) == 1) {
      pcVar8[4] = '\n';
      pcVar8 = pcVar8 + 5;
      iVar5 = 0;
    }
    else {
      pcVar8 = pcVar8 + 4;
    }
    this = this + 3;
    lVar9 = lVar9 + -3;
  } while( true );
}

Assistant:

String encodeBase64(ArrayPtr<const byte> input, bool breakLines) {
  /* set up a destination buffer large enough to hold the encoded data */
  // equivalent to ceil(input.size() / 3) * 4
  auto numChars = (input.size() + 2) / 3 * 4;
  if (breakLines) {
    // Add space for newline characters.
    uint lineCount = numChars / CHARS_PER_LINE;
    if (numChars % CHARS_PER_LINE > 0) {
      // Partial line.
      ++lineCount;
    }
    numChars = numChars + lineCount;
  }
  auto output = heapString(numChars);
  /* keep track of our encoded position */
  char* c = output.begin();
  /* store the number of bytes encoded by a single call */
  int cnt = 0;
  size_t total = 0;
  /* we need an encoder state */
  base64_encodestate s;

  /*---------- START ENCODING ----------*/
  /* initialise the encoder state */
  base64_init_encodestate(&s);
  /* gather data from the input and send it to the output */
  cnt = base64_encode_block((const char *)input.begin(), input.size(), c, &s, breakLines);
  c += cnt;
  total += cnt;

  /* since we have encoded the entire input string, we know that
     there is no more input data; finalise the encoding */
  cnt = base64_encode_blockend(c, &s, breakLines);
  c += cnt;
  total += cnt;
  /*---------- STOP ENCODING  ----------*/

  KJ_ASSERT(total == output.size(), total, output.size());

  return output;
}